

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::initPrograms
          (SamplerTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VkImageViewType VVar3;
  bool bVar4;
  CompressedTexFormat format;
  TextureChannelClass TVar5;
  TextureFormat TVar6;
  ostream *poVar7;
  size_t sVar8;
  ProgramSources *pPVar9;
  char *pcVar10;
  char *__s;
  Vec4 lookupBias;
  Vec4 lookupScale;
  ostringstream fragmentSrc;
  ostringstream vertexSrc;
  string local_4f8;
  long *local_4d8;
  long local_4d0;
  long local_4c8 [2];
  Vec4 local_4b8;
  Vec4 local_4a8;
  long local_498 [3];
  uint auStack_480 [22];
  ios_base local_428 [264];
  uint local_320 [2];
  value_type local_318 [3];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  ChannelType channelType;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  bVar4 = ::vk::isCompressedFormat(this->m_imageFormat);
  if (bVar4) {
    format = ::vk::mapVkCompressedFormat(this->m_imageFormat);
    TVar6 = tcu::getUncompressedFormat(format);
    channelType = TVar6.type;
  }
  else {
    TVar6 = ::vk::mapVkFormat(this->m_imageFormat);
    channelType = TVar6.type;
  }
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  local_4b8.m_data[0] = 0.0;
  local_4b8.m_data[1] = 0.0;
  local_4b8.m_data[2] = 0.0;
  local_4b8.m_data[3] = 0.0;
  getLookupScaleBias(this->m_imageFormat,&local_4a8,&local_4b8);
  switch(this->m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    __s = "x";
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    __s = "xy";
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    __s = "xyz";
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    __s = "xyzw";
    break;
  default:
    bVar4 = true;
    __s = (char *)0x0;
    goto LAB_004da539;
  }
  bVar4 = false;
LAB_004da539:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in vec4 position;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 1) in vec4 texCoords;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out highp vec4 vtxTexCoords;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvec4 gl_Position;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tgl_Position = position;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvtxTexCoords = texCoords;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"layout(set = 0, binding = 0) uniform highp ",0x2b);
  VVar3 = this->m_imageViewType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  TVar5 = tcu::getTextureChannelClass(channelType);
  if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar10 = "u";
  }
  else {
    TVar5 = tcu::getTextureChannelClass(channelType);
    if (TVar5 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_004da6e2;
    pcVar10 = "i";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,1);
LAB_004da6e2:
  if (VVar3 < VK_IMAGE_VIEW_TYPE_LAST) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,&DAT_00abb748 + *(int *)(&DAT_00abb748 + (ulong)VVar3 * 4),
               *(long *)(&DAT_00abb768 + (ulong)VVar3 * 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_498,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," texSampler;\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"layout(location = 0) in highp vec4 vtxTexCoords;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tfragColor = ",0xd);
  paVar1 = &local_4f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if (this->m_samplerLod <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_498,"texture(texSampler, vtxTexCoords.",0x21);
    if (bVar4) {
      std::ios::clear((int)&local_4f8 + (int)*(undefined8 *)(local_498[0] + -0x18) + 0x60);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,")",1);
    *(uint *)((long)auStack_480 + *(long *)(local_498[0] + -0x18)) =
         *(uint *)((long)auStack_480 + *(long *)(local_498[0] + -0x18)) & 0xfffffefb | 4;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_498,"textureLod(texSampler, vtxTexCoords.",0x24);
    if (bVar4) {
      std::ios::clear((int)&local_4f8 + (int)*(undefined8 *)(local_498[0] + -0x18) + 0x60);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,", ",2);
    *(uint *)((long)auStack_480 + *(long *)(local_498[0] + -0x18)) =
         *(uint *)((long)auStack_480 + *(long *)(local_498[0] + -0x18)) & 0xfffffefb | 4;
    poVar7 = std::ostream::_M_insert<double>((double)this->m_samplerLod);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," * vec4",7);
  *(uint *)((long)auStack_480 + *(long *)(local_498[0] + -0x18)) =
       *(uint *)((long)auStack_480 + *(long *)(local_498[0] + -0x18)) & 0xfffffefb | 0x100;
  poVar7 = tcu::operator<<((ostream *)local_498,&local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," + vec4",7);
  poVar7 = tcu::operator<<(poVar7,&local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"tex_vert","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_4f8);
  std::__cxx11::stringbuf::str();
  local_320[0] = 0;
  paVar2 = &local_318[0].field_2;
  local_318[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_4d8,local_4d0 + (long)local_4d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + local_320[0],local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_318[0]._M_dataplus._M_p,local_318[0].field_2._M_allocated_capacity + 1);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8,local_4c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"tex_frag","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_4f8);
  std::__cxx11::stringbuf::str();
  local_320[0] = 1;
  local_318[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_4d8,local_4d0 + (long)local_4d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + local_320[0],local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_318[0]._M_dataplus._M_p,local_318[0].field_2._M_allocated_capacity + 1);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8,local_4c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void SamplerTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream				vertexSrc;
	std::ostringstream				fragmentSrc;
	const char*						texCoordSwizzle	= DE_NULL;
	tcu::TextureFormat				format			= (isCompressedFormat(m_imageFormat)) ? tcu::getUncompressedFormat(mapVkCompressedFormat(m_imageFormat))
																						  : mapVkFormat(m_imageFormat);
	tcu::Vec4						lookupScale;
	tcu::Vec4						lookupBias;

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			texCoordSwizzle = "x";
			break;
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D:
			texCoordSwizzle = "xy";
			break;
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_3D:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			texCoordSwizzle = "xyz";
			break;
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			texCoordSwizzle = "xyzw";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	vertexSrc << "#version 440\n"
			  << "layout(location = 0) in vec4 position;\n"
			  << "layout(location = 1) in vec4 texCoords;\n"
			  << "layout(location = 0) out highp vec4 vtxTexCoords;\n"
			  << "out gl_PerVertex {\n"
			  << "	vec4 gl_Position;\n"
			  << "};\n"
			  << "void main (void)\n"
			  << "{\n"
			  << "	gl_Position = position;\n"
			  << "	vtxTexCoords = texCoords;\n"
			  << "}\n";

	fragmentSrc << "#version 440\n"
				<< "layout(set = 0, binding = 0) uniform highp " << getGlslSamplerType(format, m_imageViewType) << " texSampler;\n"
				<< "layout(location = 0) in highp vec4 vtxTexCoords;\n"
				<< "layout(location = 0) out highp vec4 fragColor;\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "	fragColor = ";

	if (m_samplerLod > 0.0f)
		fragmentSrc << "textureLod(texSampler, vtxTexCoords." << texCoordSwizzle << ", " << std::fixed <<  m_samplerLod << ")";
	else
		fragmentSrc << "texture(texSampler, vtxTexCoords." << texCoordSwizzle << ")" << std::fixed;

	fragmentSrc << " * vec4" << std::scientific << lookupScale << " + vec4" << lookupBias << ";\n"
				<< "}\n";

	sourceCollections.glslSources.add("tex_vert") << glu::VertexSource(vertexSrc.str());
	sourceCollections.glslSources.add("tex_frag") << glu::FragmentSource(fragmentSrc.str());
}